

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O3

void __thiscall
trompeloeil::call_matcher<void_(),_std::tuple<>_>::call_matcher<>
          (call_matcher<void_(),_std::tuple<>_> *this,char *file,unsigned_long line,
          char *call_string)

{
  sequence_handler_base *psVar1;
  
  (this->super_call_matcher_base<void_()>).super_list_elem<trompeloeil::call_matcher_base<void_()>_>
  .next = (list_elem<trompeloeil::call_matcher_base<void_()>_> *)this;
  (this->super_call_matcher_base<void_()>).super_list_elem<trompeloeil::call_matcher_base<void_()>_>
  .prev = (list_elem<trompeloeil::call_matcher_base<void_()>_> *)this;
  (this->super_call_matcher_base<void_()>).loc.file = file;
  (this->super_call_matcher_base<void_()>).loc.line = line;
  (this->super_call_matcher_base<void_()>).name = call_string;
  (this->super_call_matcher_base<void_()>).super_list_elem<trompeloeil::call_matcher_base<void_()>_>
  ._vptr_list_elem = (_func_int **)&PTR__call_matcher_00189e48;
  (this->super_expectation)._vptr_expectation = (_func_int **)&DAT_00189eb0;
  (this->conditions).super_list_elem<trompeloeil::condition_base<void_()>_>.next =
       &(this->conditions).super_list_elem<trompeloeil::condition_base<void_()>_>;
  (this->conditions).super_list_elem<trompeloeil::condition_base<void_()>_>.prev =
       &(this->conditions).super_list_elem<trompeloeil::condition_base<void_()>_>;
  (this->conditions).super_list_elem<trompeloeil::condition_base<void_()>_>._vptr_list_elem =
       (_func_int **)&PTR__list_00189f40;
  (this->actions).super_list_elem<trompeloeil::side_effect_base<void_()>_>.next =
       &(this->actions).super_list_elem<trompeloeil::side_effect_base<void_()>_>;
  (this->actions).super_list_elem<trompeloeil::side_effect_base<void_()>_>.prev =
       &(this->actions).super_list_elem<trompeloeil::side_effect_base<void_()>_>;
  (this->actions).super_list_elem<trompeloeil::side_effect_base<void_()>_>._vptr_list_elem =
       (_func_int **)&PTR__list_00189fd8;
  (this->return_handler_obj)._M_t.
  super___uniq_ptr_impl<trompeloeil::return_handler<void_()>,_std::default_delete<trompeloeil::return_handler<void_()>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_trompeloeil::return_handler<void_()>_*,_std::default_delete<trompeloeil::return_handler<void_()>_>_>
  .super__Head_base<0UL,_trompeloeil::return_handler<void_()>_*,_false>._M_head_impl =
       (return_handler<void_()> *)0x0;
  psVar1 = (sequence_handler_base *)operator_new(0x38);
  psVar1->min_calls = 1;
  psVar1->max_calls = 1;
  psVar1->call_count = 0;
  psVar1->_vptr_sequence_handler_base = (_func_int **)&PTR__sequence_handler_0018a060;
  psVar1[1]._vptr_sequence_handler_base = (_func_int **)0x0;
  psVar1[1].min_calls = 0;
  psVar1[1].max_calls = 0;
  (this->sequences)._M_t.
  super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
  .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl = psVar1;
  this->reported = false;
  return;
}

Assistant:

call_matcher(
      char const *file,
      unsigned long line,
      char const *call_string,
      U &&... u)
    : call_matcher_base<Sig>(location{file, line}, call_string)
    , val(std::forward<U>(u)...)
    {}